

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void __thiscall sysapi::epoll_registration::~epoll_registration(epoll_registration *this)

{
  _Manager_type p_Var1;
  
  if (this->ep != (epoll *)0x0) {
    epoll::remove(this->ep,(char *)(ulong)(uint)this->fd);
    this->ep = (epoll *)0x0;
    this->fd = -1;
    this->events = 0;
  }
  p_Var1 = (this->callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  return;
}

Assistant:

epoll_registration::~epoll_registration()
{
    clear();
}